

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall ON_Material::AddTexture(ON_Material *this,wchar_t *filename,TYPE type)

{
  ON_Texture *pOVar1;
  uint uVar2;
  
  uVar2 = FindTexture(this,(wchar_t *)0x0,type,-1);
  if ((int)uVar2 < 0) {
    uVar2 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
    ON_ClassArray<ON_Texture>::AppendNew(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
    if ((int)uVar2 < 0) {
      return uVar2;
    }
  }
  ON_FileReference::SetFullPath
            (&(this->m_textures).super_ON_ClassArray<ON_Texture>.m_a[uVar2].m_image_file_reference,
             filename,false);
  pOVar1 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_a;
  pOVar1[uVar2].m_type = type;
  pOVar1[uVar2].m_mode = modulate_texture;
  pOVar1[uVar2].m_magfilter = linear_filter;
  ON_CreateUuid(&pOVar1[uVar2].m_texture_id);
  return uVar2;
}

Assistant:

int ON_Material::AddTexture(const wchar_t* filename,ON_Texture::TYPE type)
{
  int ti = FindTexture(nullptr,type);
  if ( ti < 0 )
  {
    ti = m_textures.Count();
    m_textures.AppendNew();
  }
  if (ti >= 0 )
  {
    m_textures[ti].m_image_file_reference.SetFullPath(filename,false);
    m_textures[ti].m_type = type;
    m_textures[ti].m_mode = ON_Texture::MODE::modulate_texture;
    m_textures[ti].m_magfilter = ON_Texture::FILTER::linear_filter;
    ON_CreateUuid(m_textures[ti].m_texture_id);
  }
  return ti;
}